

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_s2c_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,
              secp256k1_ecdsa_s2c_opening *s2c_opening,uchar *msg32,uchar *seckey,uchar *s2c_data32)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  uint64_t uVar9;
  uchar ndata [32];
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_sha256 s2c_sha;
  
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_ecdsa_s2c_sign_cold_5();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_ecdsa_s2c_sign_cold_4();
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_s2c_sign_cold_3();
  }
  else if (seckey == (uchar *)0x0) {
    secp256k1_ecdsa_s2c_sign_cold_2();
  }
  else {
    if (s2c_data32 != (uchar *)0x0) {
      s2c_sha.s[0] = 0xfeefd675;
      s2c_sha.s[1] = 0x73166c99;
      s2c_sha.s[2] = 0xe2309cb8;
      s2c_sha.s[3] = 0x6d458113;
      s2c_sha.s[4] = 0x1d3a512;
      s2c_sha.s[5] = 0xe18112;
      s2c_sha.s[6] = 0x37ee0874;
      s2c_sha.s[7] = 0x421fc55f;
      s2c_sha.bytes = 0x40;
      secp256k1_sha256_write(&s2c_sha,s2c_data32,0x20);
      secp256k1_sha256_finalize(&s2c_sha,ndata);
      s2c_sha.s[0] = 0xa9b21c7b;
      s2c_sha.s[1] = 0x358c3e3e;
      s2c_sha.s[2] = 0xb6863d1;
      s2c_sha.s[3] = 0xc62b2035;
      s2c_sha.s[4] = 0xb44b40ce;
      s2c_sha.s[5] = 0x254a8912;
      s2c_sha.s[6] = 0xf85d0d4;
      s2c_sha.s[7] = 0x8a5bf91c;
      s2c_sha.bytes = 0x40;
      uVar9 = 0;
      iVar8 = secp256k1_ecdsa_sign_inner
                        (ctx,&r,&s,(int *)0x0,&s2c_sha,s2c_opening,s2c_data32,msg32,seckey,
                         (secp256k1_nonce_function)0x0,ndata);
      uVar1 = uVar9;
      uVar2 = uVar9;
      uVar3 = uVar9;
      uVar4 = uVar9;
      uVar5 = uVar9;
      uVar6 = uVar9;
      uVar7 = uVar9;
      if (iVar8 != 0) {
        uVar9 = s.d[3];
        uVar1 = s.d[1];
        uVar2 = r.d[3];
        uVar3 = r.d[2];
        uVar4 = s.d[0];
        uVar5 = s.d[2];
        uVar6 = r.d[0];
        uVar7 = r.d[1];
      }
      *(uint64_t *)signature->data = uVar6;
      *(uint64_t *)(signature->data + 8) = uVar7;
      *(uint64_t *)(signature->data + 0x10) = uVar3;
      *(uint64_t *)(signature->data + 0x18) = uVar2;
      *(uint64_t *)(signature->data + 0x20) = uVar4;
      *(uint64_t *)(signature->data + 0x28) = uVar1;
      *(uint64_t *)(signature->data + 0x30) = uVar5;
      *(uint64_t *)(signature->data + 0x38) = uVar9;
      return iVar8;
    }
    secp256k1_ecdsa_s2c_sign_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_s2c_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature* signature, secp256k1_ecdsa_s2c_opening* s2c_opening, const unsigned char
 *msg32, const unsigned char *seckey, const unsigned char* s2c_data32) {
    secp256k1_scalar r, s;
    int ret;
    unsigned char ndata[32];
    secp256k1_sha256 s2c_sha;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(s2c_data32 != NULL);

    /* Provide `s2c_data32` to the nonce function as additional data to
     * derive the nonce. It is first hashed because it should be possible
     * to derive nonces even if only a SHA256 commitment to the data is
     * known.  This is important in the ECDSA anti-exfil protocol. */
    secp256k1_s2c_ecdsa_data_sha256_tagged(&s2c_sha);
    secp256k1_sha256_write(&s2c_sha, s2c_data32, 32);
    secp256k1_sha256_finalize(&s2c_sha, ndata);

    secp256k1_s2c_ecdsa_point_sha256_tagged(&s2c_sha);
    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, &s2c_sha, s2c_opening, s2c_data32, msg32, seckey, NULL, ndata);
    secp256k1_scalar_cmov(&r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_zero, !ret);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}